

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText
               (ImDrawVert *vert_start,ImDrawVert *vert_end,float gradient_p0_x,float gradient_p1_x)

{
  float fVar1;
  float fVar2;
  int a;
  float alpha_mul;
  float d;
  ImDrawVert *vert;
  int full_alpha_count;
  float gradient_inv_length2;
  float gradient_extent_x;
  float gradient_p1_x_local;
  float gradient_p0_x_local;
  ImDrawVert *vert_end_local;
  ImDrawVert *vert_start_local;
  
  fVar1 = gradient_p1_x - gradient_p0_x;
  vert._4_4_ = 0;
  _alpha_mul = vert_end + -1;
  while( true ) {
    if (_alpha_mul < vert_start) {
      return;
    }
    fVar2 = ImClamp<float>(((_alpha_mul->pos).x - gradient_p0_x) * fVar1 * (1.0 / (fVar1 * fVar1)),
                           0.0,1.0);
    if ((1.0 <= 1.0 - fVar2) && (vert._4_4_ = vert._4_4_ + 1, 2 < vert._4_4_)) break;
    _alpha_mul->col =
         _alpha_mul->col & 0xffffff |
         (int)((float)*(byte *)((long)&_alpha_mul->col + 3) * (1.0 - fVar2)) << 0x18;
    _alpha_mul = _alpha_mul + -1;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText(ImDrawVert* vert_start, ImDrawVert* vert_end, float gradient_p0_x, float gradient_p1_x)
{
    float gradient_extent_x = gradient_p1_x - gradient_p0_x;
    float gradient_inv_length2 = 1.0f / (gradient_extent_x * gradient_extent_x);
    int full_alpha_count = 0;
    for (ImDrawVert* vert = vert_end - 1; vert >= vert_start; vert--)
    {
        float d = (vert->pos.x - gradient_p0_x) * (gradient_extent_x);
        float alpha_mul = 1.0f - ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        if (alpha_mul >= 1.0f && ++full_alpha_count > 2)
            return; // Early out
        int a = (int)(((vert->col >> IM_COL32_A_SHIFT) & 0xFF) * alpha_mul);
        vert->col = (vert->col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
    }
}